

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDirectDemo_ls.c
# Opt level: O0

int Jac2(sunrealtype tn,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,
        N_Vector tmp2,N_Vector tmp3)

{
  undefined8 *puVar1;
  sunrealtype *kthCol;
  int k;
  int j;
  int i;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype tn_local;
  
  for (j = 0; j < 5; j = j + 1) {
    for (i = 0; i < 5; i = i + 1) {
      puVar1 = (undefined8 *)
               (*(long *)(*(long *)((long)J->content + 0x40) + (long)(i + j * 5) * 8) +
               *(long *)((long)J->content + 0x28) * 8);
      *puVar1 = 0xc000000000000000;
      if (i != 4) {
        puVar1[1] = 0x3ff0000000000000;
      }
      if (j != 4) {
        puVar1[5] = 0x3ff0000000000000;
      }
    }
  }
  return 0;
}

Assistant:

static int Jac2(sunrealtype tn, N_Vector y, N_Vector fy, SUNMatrix J,
                void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  int i, j, k;
  sunrealtype* kthCol;

  /*
     The components of f(t,y) which depend on y    are
                                               i,j
     f    , f      , and f      :
      i,j    i+1,j        i,j+1

     f    = -2 y    + alpha1 * y      + alpha2 * y
      i,j       i,j             i-1,j             i,j-1

     f      = -2 y      + alpha1 * y    + alpha2 * y
      i+1,j       i+1,j             i,j             i+1,j-1

     f      = -2 y      + alpha1 * y        + alpha2 * y
      i,j+1       i,j+1             i-1,j+1             i,j
  */

  for (j = 0; j < P2_MESHY; j++)
  {
    for (i = 0; i < P2_MESHX; i++)
    {
      k                                 = i + j * P2_MESHX;
      kthCol                            = SM_COLUMN_B(J, k);
      SM_COLUMN_ELEMENT_B(kthCol, k, k) = -TWO;
      if (i != P2_MESHX - 1)
      {
        SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = P2_ALPH1;
      }
      if (j != P2_MESHY - 1)
      {
        SM_COLUMN_ELEMENT_B(kthCol, k + P2_MESHX, k) = P2_ALPH2;
      }
    }
  }

  return (0);
}